

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O1

iterator * __thiscall bitdeque<32768>::end(iterator *__return_storage_ptr__,bitdeque<32768> *this)

{
  long in_FS_OFFSET;
  Iterator<false> local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_it._M_cur =
       (this->m_deque).
       super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_48.m_it._M_first =
       (this->m_deque).
       super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_48.m_it._M_last =
       (this->m_deque).
       super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_48.m_it._M_node =
       (this->m_deque).
       super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  local_48.m_bitpos = 0;
  Iterator<false>::operator+=(&local_48,-(long)this->m_pad_end);
  (__return_storage_ptr__->m_it)._M_cur = local_48.m_it._M_cur;
  (__return_storage_ptr__->m_it)._M_first = local_48.m_it._M_first;
  *(undefined4 *)&(__return_storage_ptr__->m_it)._M_last = local_48.m_it._M_last._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_it)._M_last + 4) = local_48.m_it._M_last._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->m_it)._M_node = local_48.m_it._M_node._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_it)._M_node + 4) = local_48.m_it._M_node._4_4_;
  __return_storage_ptr__->m_bitpos = local_48.m_bitpos;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() noexcept { return iterator{m_deque.end(), 0} - m_pad_end; }